

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fPolygonOffsetTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Functional::PolygonOffsetTests::init(PolygonOffsetTests *this,EVP_PKEY_CTX *ctx)

{
  GLenum internalFormat;
  Context *pCVar1;
  char *__s;
  int in_EAX;
  PolygonOffsetTestCase *pPVar2;
  long lVar3;
  int in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  lVar3 = 0x10;
  while (lVar3 != 0x70) {
    pPVar2 = (PolygonOffsetTestCase *)operator_new(0x90);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    __s = *(char **)((long)&DAT_01e40f80 + lVar3);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,__s,(allocator<char> *)&stack0xffffffffffffff7b);
    std::operator+(&local_78,&local_58,"_enable");
    internalFormat = *(GLenum *)((long)&PTR_iterate_01e40f70 + lVar3);
    local_38 = lVar3;
    Functional::anon_unknown_0::PolygonOffsetTestCase::PolygonOffsetTestCase
              (pPVar2,pCVar1,local_78._M_dataplus._M_p,"test enable GL_POLYGON_OFFSET_FILL",
               internalFormat,__s,in_stack_ffffffffffffff78);
    (pPVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__TestCase_01e41008;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pPVar2);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_58);
    pPVar2 = (PolygonOffsetTestCase *)operator_new(0x90);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,__s,(allocator<char> *)&stack0xffffffffffffff7b);
    std::operator+(&local_78,&local_58,"_displacement_with_units");
    Functional::anon_unknown_0::PolygonOffsetTestCase::PolygonOffsetTestCase
              (pPVar2,pCVar1,local_78._M_dataplus._M_p,"test polygon offset",internalFormat,__s,
               in_stack_ffffffffffffff78);
    (pPVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__TestCase_01e41138;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pPVar2);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_58);
    pPVar2 = (PolygonOffsetTestCase *)operator_new(0x90);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,__s,(allocator<char> *)&stack0xffffffffffffff7b);
    std::operator+(&local_78,&local_58,"_render_with_units");
    Functional::anon_unknown_0::PolygonOffsetTestCase::PolygonOffsetTestCase
              (pPVar2,pCVar1,local_78._M_dataplus._M_p,"test polygon offset",internalFormat,__s,
               in_stack_ffffffffffffff78);
    (pPVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__TestCase_01e41190;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pPVar2);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_58);
    pPVar2 = (PolygonOffsetTestCase *)operator_new(0x90);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,__s,(allocator<char> *)&stack0xffffffffffffff7b);
    std::operator+(&local_78,&local_58,"_result_depth_clamp");
    Functional::anon_unknown_0::PolygonOffsetTestCase::PolygonOffsetTestCase
              (pPVar2,pCVar1,local_78._M_dataplus._M_p,"test polygon offset clamping",internalFormat
               ,__s,in_stack_ffffffffffffff78);
    (pPVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__TestCase_01e411e8;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pPVar2);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_58);
    pPVar2 = (PolygonOffsetTestCase *)operator_new(0x90);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,__s,(allocator<char> *)&stack0xffffffffffffff7b);
    std::operator+(&local_78,&local_58,"_render_with_factor");
    Functional::anon_unknown_0::PolygonOffsetTestCase::PolygonOffsetTestCase
              (pPVar2,pCVar1,local_78._M_dataplus._M_p,"test polygon offset factor",internalFormat,
               __s,in_stack_ffffffffffffff78);
    (pPVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__TestCase_01e41240;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pPVar2);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_58);
    pPVar2 = (PolygonOffsetTestCase *)operator_new(0x90);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,__s,(allocator<char> *)&stack0xffffffffffffff7b);
    std::operator+(&local_78,&local_58,"_factor_0_slope");
    Functional::anon_unknown_0::PolygonOffsetTestCase::PolygonOffsetTestCase
              (pPVar2,pCVar1,local_78._M_dataplus._M_p,"test polygon offset factor",internalFormat,
               __s,in_stack_ffffffffffffff78);
    (pPVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__TestCase_01e41298;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pPVar2);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_58);
    pPVar2 = (PolygonOffsetTestCase *)operator_new(0x90);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,__s,(allocator<char> *)&stack0xffffffffffffff7b);
    std::operator+(&local_78,&local_58,"_factor_1_slope");
    Functional::anon_unknown_0::PolygonOffsetTestCase::PolygonOffsetTestCase
              (pPVar2,pCVar1,local_78._M_dataplus._M_p,"test polygon offset factor",internalFormat,
               __s,in_stack_ffffffffffffff78);
    (pPVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__TestCase_01e412f0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pPVar2);
    std::__cxx11::string::~string((string *)&local_78);
    in_EAX = std::__cxx11::string::~string((string *)&local_58);
    lVar3 = local_38 + 0x18;
  }
  return in_EAX;
}

Assistant:

void PolygonOffsetTests::init (void)
{
	const struct DepthBufferFormat
	{
		enum BufferType
		{
			TYPE_FIXED_POINT,
			TYPE_FLOATING_POINT,
			TYPE_UNKNOWN
		};

		GLenum		internalFormat;
		int			bits;
		BufferType	floatingPoint;
		const char* name;
	} depthFormats[]=
	{
		{ 0,						0,		DepthBufferFormat::TYPE_UNKNOWN,		"default" },
		{ GL_DEPTH_COMPONENT16,		16,		DepthBufferFormat::TYPE_FIXED_POINT,	"fixed16" },
		{ GL_DEPTH_COMPONENT24,		24,		DepthBufferFormat::TYPE_FIXED_POINT,	"fixed24" },
		{ GL_DEPTH_COMPONENT32F,	32,		DepthBufferFormat::TYPE_FLOATING_POINT,	"float32" },
	};

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(depthFormats); ++ndx)
	{
		const DepthBufferFormat& format = depthFormats[ndx];

		// enable works?
		addChild(new UsageTestCase(m_context, (std::string(format.name) + "_enable").c_str(), "test enable GL_POLYGON_OFFSET_FILL", format.internalFormat, format.name));

		// Really moves the polygons ?
		addChild(new UsageDisplacementTestCase(m_context, (std::string(format.name) + "_displacement_with_units").c_str(), "test polygon offset", format.internalFormat, format.name));

		// Really moves the polygons to right direction ?
		addChild(new UsagePositiveNegativeTestCase(m_context, (std::string(format.name) + "_render_with_units").c_str(), "test polygon offset", format.internalFormat, format.name));

		// Is total result clamped to [0,1] like promised?
		addChild(new ResultClampingTestCase(m_context, (std::string(format.name) + "_result_depth_clamp").c_str(), "test polygon offset clamping", format.internalFormat, format.name));

		// Slope really moves the polygon?
		addChild(new UsageSlopeTestCase(m_context, (std::string(format.name) + "_render_with_factor").c_str(), "test polygon offset factor", format.internalFormat, format.name));

		// Factor with zero slope
		addChild(new ZeroSlopeTestCase(m_context, (std::string(format.name) + "_factor_0_slope").c_str(), "test polygon offset factor", format.internalFormat, format.name));

		// Factor with 1.0 slope
		addChild(new OneSlopeTestCase(m_context, (std::string(format.name) + "_factor_1_slope").c_str(), "test polygon offset factor", format.internalFormat, format.name));
	}
}